

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

uint64_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::NewId(ShardedLRUCache *this)

{
  uint64_t uVar1;
  MutexLock local_18;
  MutexLock l;
  ShardedLRUCache *this_local;
  
  l.mu_ = (Mutex *)this;
  MutexLock::MutexLock(&local_18,&this->id_mutex_);
  uVar1 = this->last_id_ + 1;
  this->last_id_ = uVar1;
  MutexLock::~MutexLock(&local_18);
  return uVar1;
}

Assistant:

uint64_t NewId() override {
    MutexLock l(&id_mutex_);
    return ++(last_id_);
  }